

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O0

bool Jinx::Impl::GetDelimiterAndFormat(String *value,char *delimiter,NumericFormat *format)

{
  char cVar1;
  size_type sVar2;
  const_reference pvVar3;
  char local_5b;
  char local_59;
  ulong uStack_48;
  char c;
  size_t i;
  size_t semicolonCount;
  size_t commaCount;
  size_t tabCount;
  NumericFormat *format_local;
  char *delimiter_local;
  String *value_local;
  
  commaCount = 0;
  semicolonCount = 0;
  i = 0;
  for (uStack_48 = 0;
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                        (value), uStack_48 < sVar2; uStack_48 = uStack_48 + 1) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
             operator[](value,uStack_48);
    cVar1 = *pvVar3;
    if (cVar1 == '\t') {
      commaCount = commaCount + 1;
    }
    else if (cVar1 == ',') {
      semicolonCount = semicolonCount + 1;
    }
    else if (cVar1 == ';') {
      i = i + 1;
    }
    else if ((cVar1 == '\n') && (uStack_48 != 0)) break;
  }
  if (((commaCount == 0) && (semicolonCount == 0)) && (i == 0)) {
    value_local._7_1_ = false;
  }
  else {
    if (semicolonCount < commaCount) {
      local_5b = '\t';
    }
    else {
      local_59 = ',';
      if (semicolonCount <= i) {
        local_59 = ';';
      }
      local_5b = local_59;
    }
    *delimiter = local_5b;
    *format = (uint)(*delimiter == ';');
    value_local._7_1_ = true;
  }
  return value_local._7_1_;
}

Assistant:

inline_t bool GetDelimiterAndFormat(const String & value, char & delimiter, NumericFormat & format)
	{
		size_t tabCount = 0;
		size_t commaCount = 0;
		size_t semicolonCount = 0;
		for (size_t i = 0; i < value.size(); ++i)
		{
			char c = value[i];
			if (c == '\t')
				++tabCount;
			else if (c == ',')
				++commaCount;
			else if (c == ';')
				++semicolonCount;
			else if (c == '\n' && i != 0)
				break;
		}
		if (tabCount == 0 && commaCount == 0 && semicolonCount == 0)
			return false;
		delimiter = (commaCount >= tabCount) ? ((commaCount > semicolonCount) ? ',' : ';') : '\t';
		format = delimiter == ';' ? NumericFormat::Continental : NumericFormat::International;
		return true;
	}